

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O3

void __thiscall cmCTestTestHandler::GenerateCTestXML(cmCTestTestHandler *this,cmXMLWriter *xml)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  pointer pcVar4;
  cmCTestTestProperties *pcVar5;
  char *pcVar6;
  cmCTestTestResult *result;
  bool bVar7;
  long *plVar8;
  _Rb_tree_node_base *p_Var9;
  size_type *psVar10;
  cmCTestTestHandler *pcVar11;
  cmCTestTestHandler *this_00;
  pointer pcVar12;
  string testPath;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string local_c8;
  string local_a8;
  cmCTestTestHandler *local_88;
  pointer local_80;
  cmCTestTestResult *local_78;
  string local_70;
  string local_50;
  
  bVar7 = cmCTest::GetProduceXML((this->super_cmCTestGenericHandler).CTest);
  if (bVar7) {
    cmCTest::StartXML((this->super_cmCTestGenericHandler).CTest,xml,
                      (this->super_cmCTestGenericHandler).AppendXML);
    cmCTest::GenerateSubprojectsOutput((this->super_cmCTestGenericHandler).CTest,xml);
    paVar1 = &local_c8.field_2;
    local_c8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"Testing","");
    cmXMLWriter::StartElement(xml,&local_c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != paVar1) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    local_c8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"StartDateTime","");
    cmXMLWriter::StartElement(xml,&local_c8);
    cmXMLWriter::Content<std::__cxx11::string>(xml,&this->StartTest);
    cmXMLWriter::EndElement(xml);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != paVar1) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    local_c8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"StartTestTime","");
    cmXMLWriter::
    Element<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>
              (xml,&local_c8,&this->StartTestTime);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != paVar1) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    local_c8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"TestList","");
    cmXMLWriter::StartElement(xml,&local_c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != paVar1) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    pcVar12 = (this->TestResults).
              super__Vector_base<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pcVar3 = (this->TestResults).
             super__Vector_base<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_88 = this;
    if (pcVar12 != pcVar3) {
      paVar2 = &local_a8.field_2;
      do {
        pcVar4 = (pcVar12->Path)._M_dataplus._M_p;
        local_a8._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_a8,pcVar4,pcVar4 + (pcVar12->Path)._M_string_length);
        std::__cxx11::string::append((char *)&local_a8);
        plVar8 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_a8,(ulong)(pcVar12->Name)._M_dataplus._M_p);
        psVar10 = (size_type *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar10) {
          local_c8.field_2._M_allocated_capacity = *psVar10;
          local_c8.field_2._8_8_ = plVar8[3];
          local_c8._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_c8.field_2._M_allocated_capacity = *psVar10;
          local_c8._M_dataplus._M_p = (pointer)*plVar8;
        }
        local_c8._M_string_length = plVar8[1];
        *plVar8 = (long)psVar10;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != paVar2) {
          operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
        }
        local_a8._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"Test","");
        cmCTest::GetShortPathToFile
                  (&local_70,(local_88->super_cmCTestGenericHandler).CTest,&local_c8);
        cmXMLWriter::StartElement(xml,&local_a8);
        cmXMLWriter::Content<std::__cxx11::string>(xml,&local_70);
        cmXMLWriter::EndElement(xml);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != paVar2) {
          operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != paVar1) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        }
        pcVar12 = pcVar12 + 1;
      } while (pcVar12 != pcVar3);
    }
    cmXMLWriter::EndElement(xml);
    pcVar12 = (local_88->TestResults).
              super__Vector_base<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_80 = (local_88->TestResults).
               super__Vector_base<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    pcVar11 = local_88;
    if (pcVar12 != local_80) {
      do {
        WriteTestResultHeader(pcVar11,xml,pcVar12);
        local_c8._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"Results","");
        cmXMLWriter::StartElement(xml,&local_c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != paVar1) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        }
        if (pcVar12->Status != 0) {
          if ((pcVar12->Status != 9) || (pcVar12->ReturnValue != 0)) {
            local_c8._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_c8,"NamedMeasurement","");
            cmXMLWriter::StartElement(xml,&local_c8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8._M_dataplus._M_p != paVar1) {
              operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
            }
            cmXMLWriter::Attribute<char[12]>(xml,"type",(char (*) [12])"text/string");
            cmXMLWriter::Attribute<char[10]>(xml,"name",(char (*) [10])"Exit Code");
            pcVar11 = (cmCTestTestHandler *)0x73bb8f;
            local_c8._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"Value","");
            GetTestStatus_abi_cxx11_(&local_a8,pcVar11,pcVar12);
            cmXMLWriter::StartElement(xml,&local_c8);
            cmXMLWriter::Content<std::__cxx11::string>(xml,&local_a8);
            cmXMLWriter::EndElement(xml);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
              operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8._M_dataplus._M_p != paVar1) {
              operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
            }
            cmXMLWriter::EndElement(xml);
            local_c8._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_c8,"NamedMeasurement","");
            cmXMLWriter::StartElement(xml,&local_c8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8._M_dataplus._M_p != paVar1) {
              operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
            }
            cmXMLWriter::Attribute<char[12]>(xml,"type",(char (*) [12])"text/string");
            cmXMLWriter::Attribute<char[11]>(xml,"name",(char (*) [11])"Exit Value");
            local_c8._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"Value","");
            cmXMLWriter::Element<long>(xml,&local_c8,&pcVar12->ReturnValue);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8._M_dataplus._M_p != paVar1) {
              operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
            }
            cmXMLWriter::EndElement(xml);
          }
          pcVar4 = (pcVar12->TestMeasurementsOutput)._M_dataplus._M_p;
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_50,pcVar4,
                     pcVar4 + (pcVar12->TestMeasurementsOutput)._M_string_length);
          RecordCustomTestMeasurements(local_88,xml,&local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          local_c8._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"NamedMeasurement","")
          ;
          cmXMLWriter::StartElement(xml,&local_c8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_dataplus._M_p != paVar1) {
            operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
          }
          cmXMLWriter::Attribute<char[15]>(xml,"type",(char (*) [15])"numeric/double");
          cmXMLWriter::Attribute<char[15]>(xml,"name",(char (*) [15])"Execution Time");
          local_c8._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"Value","");
          local_a8._M_dataplus._M_p = (pointer)(pcVar12->ExecutionTime).__r;
          cmXMLWriter::Element<double>(xml,&local_c8,(double *)&local_a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_dataplus._M_p != paVar1) {
            operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
          }
          cmXMLWriter::EndElement(xml);
          if ((pcVar12->Reason)._M_string_length != 0) {
            pcVar6 = "Test Fail Reason";
            if (pcVar12->Status == 9) {
              pcVar6 = "Test Pass Reason";
            }
            local_a8._M_dataplus._M_p = pcVar6 + 5;
            local_c8._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_c8,"NamedMeasurement","");
            cmXMLWriter::StartElement(xml,&local_c8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8._M_dataplus._M_p != paVar1) {
              operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
            }
            cmXMLWriter::Attribute<char[12]>(xml,"type",(char (*) [12])"text/string");
            cmXMLWriter::Attribute<char_const*>(xml,"name",(char **)&local_a8);
            local_c8._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"Value","");
            cmXMLWriter::StartElement(xml,&local_c8);
            cmXMLWriter::Content<std::__cxx11::string>(xml,&pcVar12->Reason);
            cmXMLWriter::EndElement(xml);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8._M_dataplus._M_p != paVar1) {
              operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
            }
            cmXMLWriter::EndElement(xml);
          }
        }
        local_c8._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"NamedMeasurement","");
        cmXMLWriter::StartElement(xml,&local_c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != paVar1) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        }
        cmXMLWriter::Attribute<char[15]>(xml,"type",(char (*) [15])"numeric/double");
        cmXMLWriter::Attribute<char[11]>(xml,"name",(char (*) [11])"Processors");
        local_c8._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"Value","");
        cmXMLWriter::Element<int>(xml,&local_c8,&pcVar12->Properties->Processors);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != paVar1) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        }
        cmXMLWriter::EndElement(xml);
        local_c8._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"NamedMeasurement","");
        cmXMLWriter::StartElement(xml,&local_c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != paVar1) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        }
        cmXMLWriter::Attribute<char[12]>(xml,"type",(char (*) [12])"text/string");
        cmXMLWriter::Attribute<char[18]>(xml,"name",(char (*) [18])"Completion Status");
        if ((pcVar12->CustomCompletionStatus)._M_string_length == 0) {
          local_c8._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"Value","");
          cmXMLWriter::StartElement(xml,&local_c8);
          cmXMLWriter::Content<std::__cxx11::string>(xml,&pcVar12->CompletionStatus);
          cmXMLWriter::EndElement(xml);
        }
        else {
          local_c8._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"Value","");
          cmXMLWriter::StartElement(xml,&local_c8);
          cmXMLWriter::Content<std::__cxx11::string>(xml,&pcVar12->CustomCompletionStatus);
          cmXMLWriter::EndElement(xml);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != paVar1) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        }
        cmXMLWriter::EndElement(xml);
        local_c8._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"NamedMeasurement","");
        cmXMLWriter::StartElement(xml,&local_c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != paVar1) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        }
        cmXMLWriter::Attribute<char[12]>(xml,"type",(char (*) [12])"text/string");
        cmXMLWriter::Attribute<char[13]>(xml,"name",(char (*) [13])"Command Line");
        local_c8._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"Value","");
        cmXMLWriter::StartElement(xml,&local_c8);
        cmXMLWriter::Content<std::__cxx11::string>(xml,&pcVar12->FullCommandLine);
        cmXMLWriter::EndElement(xml);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != paVar1) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        }
        cmXMLWriter::EndElement(xml);
        local_c8._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"NamedMeasurement","");
        cmXMLWriter::StartElement(xml,&local_c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != paVar1) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        }
        cmXMLWriter::Attribute<char[12]>(xml,"type",(char (*) [12])"text/string");
        cmXMLWriter::Attribute<char[12]>(xml,"name",(char (*) [12])0x74c624);
        local_c8._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"Value","");
        cmXMLWriter::StartElement(xml,&local_c8);
        cmXMLWriter::Content<std::__cxx11::string>(xml,&pcVar12->Environment);
        cmXMLWriter::EndElement(xml);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != paVar1) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        }
        cmXMLWriter::EndElement(xml);
        pcVar5 = pcVar12->Properties;
        local_78 = pcVar12;
        for (p_Var9 = (pcVar5->Measurements)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var9 != &(pcVar5->Measurements)._M_t._M_impl.super__Rb_tree_header;
            p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9)) {
          local_c8._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"NamedMeasurement","")
          ;
          cmXMLWriter::StartElement(xml,&local_c8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_dataplus._M_p != paVar1) {
            operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
          }
          cmXMLWriter::Attribute<char[12]>(xml,"type",(char (*) [12])"text/string");
          cmXMLWriter::Attribute<std::__cxx11::string>
                    (xml,"name",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (p_Var9 + 1));
          local_c8._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"Value","");
          cmXMLWriter::StartElement(xml,&local_c8);
          cmXMLWriter::Content<std::__cxx11::string>
                    (xml,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (p_Var9 + 2));
          cmXMLWriter::EndElement(xml);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_dataplus._M_p != paVar1) {
            operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
          }
          cmXMLWriter::EndElement(xml);
        }
        local_c8._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"Measurement","");
        cmXMLWriter::StartElement(xml,&local_c8);
        result = local_78;
        pcVar11 = local_88;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != paVar1) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        }
        local_c8._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"Value","");
        cmXMLWriter::StartElement(xml,&local_c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != paVar1) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        }
        if (result->CompressOutput == true) {
          cmXMLWriter::Attribute<char[7]>(xml,"encoding",(char (*) [7])"base64");
          cmXMLWriter::Attribute<char[5]>(xml,"compression",(char (*) [5])0x7a5ab7);
        }
        cmXMLWriter::Content<std::__cxx11::string>(xml,&result->Output);
        cmXMLWriter::EndElement(xml);
        cmXMLWriter::EndElement(xml);
        cmXMLWriter::EndElement(xml);
        this_00 = pcVar11;
        AttachFiles(pcVar11,xml,result);
        WriteTestResultFooter(this_00,xml,result);
        pcVar12 = result + 1;
      } while (pcVar12 != local_80);
    }
    local_c8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"EndDateTime","");
    cmXMLWriter::StartElement(xml,&local_c8);
    cmXMLWriter::Content<std::__cxx11::string>(xml,&pcVar11->EndTest);
    cmXMLWriter::EndElement(xml);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != paVar1) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    local_c8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"EndTestTime","");
    cmXMLWriter::
    Element<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>
              (xml,&local_c8,&pcVar11->EndTestTime);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != paVar1) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    local_c8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"ElapsedMinutes","");
    local_a8._M_dataplus._M_p = (pointer)(long)((pcVar11->ElapsedTestingTime).__r / 60.0);
    cmXMLWriter::Element<long>(xml,&local_c8,(long *)&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != paVar1) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    cmXMLWriter::EndElement(xml);
    cmCTest::EndXML((pcVar11->super_cmCTestGenericHandler).CTest,xml);
  }
  return;
}

Assistant:

void cmCTestTestHandler::GenerateCTestXML(cmXMLWriter& xml)
{
  if (!this->CTest->GetProduceXML()) {
    return;
  }

  this->CTest->StartXML(xml, this->AppendXML);
  this->CTest->GenerateSubprojectsOutput(xml);
  xml.StartElement("Testing");
  xml.Element("StartDateTime", this->StartTest);
  xml.Element("StartTestTime", this->StartTestTime);
  xml.StartElement("TestList");
  for (cmCTestTestResult const& result : this->TestResults) {
    std::string testPath = result.Path + "/" + result.Name;
    xml.Element("Test", this->CTest->GetShortPathToFile(testPath));
  }
  xml.EndElement(); // TestList
  for (cmCTestTestResult& result : this->TestResults) {
    this->WriteTestResultHeader(xml, result);
    xml.StartElement("Results");

    if (result.Status != cmCTestTestHandler::NOT_RUN) {
      if (result.Status != cmCTestTestHandler::COMPLETED ||
          result.ReturnValue) {
        xml.StartElement("NamedMeasurement");
        xml.Attribute("type", "text/string");
        xml.Attribute("name", "Exit Code");
        xml.Element("Value", this->GetTestStatus(result));
        xml.EndElement(); // NamedMeasurement

        xml.StartElement("NamedMeasurement");
        xml.Attribute("type", "text/string");
        xml.Attribute("name", "Exit Value");
        xml.Element("Value", result.ReturnValue);
        xml.EndElement(); // NamedMeasurement
      }
      this->RecordCustomTestMeasurements(xml, result.TestMeasurementsOutput);
      xml.StartElement("NamedMeasurement");
      xml.Attribute("type", "numeric/double");
      xml.Attribute("name", "Execution Time");
      xml.Element("Value", result.ExecutionTime.count());
      xml.EndElement(); // NamedMeasurement
      if (!result.Reason.empty()) {
        const char* reasonType = "Pass Reason";
        if (result.Status != cmCTestTestHandler::COMPLETED) {
          reasonType = "Fail Reason";
        }
        xml.StartElement("NamedMeasurement");
        xml.Attribute("type", "text/string");
        xml.Attribute("name", reasonType);
        xml.Element("Value", result.Reason);
        xml.EndElement(); // NamedMeasurement
      }
    }

    xml.StartElement("NamedMeasurement");
    xml.Attribute("type", "numeric/double");
    xml.Attribute("name", "Processors");
    xml.Element("Value", result.Properties->Processors);
    xml.EndElement(); // NamedMeasurement

    xml.StartElement("NamedMeasurement");
    xml.Attribute("type", "text/string");
    xml.Attribute("name", "Completion Status");
    if (result.CustomCompletionStatus.empty()) {
      xml.Element("Value", result.CompletionStatus);
    } else {
      xml.Element("Value", result.CustomCompletionStatus);
    }
    xml.EndElement(); // NamedMeasurement

    xml.StartElement("NamedMeasurement");
    xml.Attribute("type", "text/string");
    xml.Attribute("name", "Command Line");
    xml.Element("Value", result.FullCommandLine);
    xml.EndElement(); // NamedMeasurement

    xml.StartElement("NamedMeasurement");
    xml.Attribute("type", "text/string");
    xml.Attribute("name", "Environment");
    xml.Element("Value", result.Environment);
    xml.EndElement(); // NamedMeasurement
    for (auto const& measure : result.Properties->Measurements) {
      xml.StartElement("NamedMeasurement");
      xml.Attribute("type", "text/string");
      xml.Attribute("name", measure.first);
      xml.Element("Value", measure.second);
      xml.EndElement(); // NamedMeasurement
    }
    xml.StartElement("Measurement");
    xml.StartElement("Value");
    if (result.CompressOutput) {
      xml.Attribute("encoding", "base64");
      xml.Attribute("compression", "gzip");
    }
    xml.Content(result.Output);
    xml.EndElement(); // Value
    xml.EndElement(); // Measurement
    xml.EndElement(); // Results

    this->AttachFiles(xml, result);
    this->WriteTestResultFooter(xml, result);
  }

  xml.Element("EndDateTime", this->EndTest);
  xml.Element("EndTestTime", this->EndTestTime);
  xml.Element(
    "ElapsedMinutes",
    std::chrono::duration_cast<std::chrono::minutes>(this->ElapsedTestingTime)
      .count());
  xml.EndElement(); // Testing
  this->CTest->EndXML(xml);
}